

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asterism_inner_http.c
# Opt level: O3

int on_header_value(http_parser *parser,char *at,size_t length)

{
  http_parser *str1;
  undefined8 *puVar1;
  uint64_t uVar2;
  int iVar3;
  long lVar4;
  
  lVar4._0_2_ = parser[1].http_major;
  lVar4._2_2_ = parser[1].http_minor;
  lVar4._4_4_ = *(undefined4 *)&parser[1].field_0x14;
  if (lVar4 == 0) {
    *(char **)&parser[1].http_major = at;
  }
  parser[1].data = (void *)((long)parser[1].data + length);
  if (*(long *)(parser + 1) == 0) {
    return 0;
  }
  str1 = parser + 1;
  iVar3 = asterism_vcasecmp((asterism_str *)str1,"Proxy-Authorization");
  if (iVar3 == 0) {
    *(byte *)&parser[5].nread = (byte)parser[5].nread & 0xf3 | 4;
    lVar4 = 0x1278;
  }
  else {
    iVar3 = asterism_vcasecmp((asterism_str *)str1,"Proxy-Connection");
    if (iVar3 != 0) goto LAB_0010c45c;
    lVar4 = 0x1288;
  }
  uVar2 = parser[1].content_length;
  puVar1 = (undefined8 *)((long)parser + lVar4 + -0x1218);
  *puVar1 = *(undefined8 *)str1;
  puVar1[1] = uVar2;
LAB_0010c45c:
  *(undefined8 *)str1 = 0;
  parser[1].content_length = 0;
  return 0;
}

Assistant:

static int on_header_value(http_parser *parser, const char *at, size_t length)
{
    struct asterism_http_incoming_s *obj = __CONTAINER_PTR(struct asterism_http_incoming_s, parser, parser);
    if (obj->http_header_value_temp.p)
    {
        obj->http_header_value_temp.len += length;
    }
    else
    {
        obj->http_header_value_temp.p = at;
        obj->http_header_value_temp.len += length;
    }
    if (obj->http_header_field_temp.p)
    {
        parse_key(obj);
    }
    return 0;
}